

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

int __thiscall
tetgenmesh::checkfac4encroach
          (tetgenmesh *this,point pa,point pb,point pc,point checkpt,double *cent,double *r)

{
  int iVar1;
  undefined4 *puVar2;
  tetgenmesh *this_00;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double rd;
  double prjpt [3];
  double n [3];
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_48;
  double local_40;
  double local_38;
  
  this_00 = this;
  circumsphere(this,pa,pb,pc,(double *)0x0,cent,&local_78);
  if ((local_78 == 0.0) && (!NAN(local_78))) {
    puVar2 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar2 = 2;
    __cxa_throw(puVar2,&int::typeinfo,0);
  }
  dVar4 = (checkpt[2] - cent[2]) * (checkpt[2] - cent[2]) +
          (*checkpt - *cent) * (*checkpt - *cent) + (checkpt[1] - cent[1]) * (checkpt[1] - cent[1]);
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  uVar3 = -(ulong)(ABS(dVar4 - local_78) / local_78 < this->b->epsilon);
  if (local_78 <= (double)(~uVar3 & (ulong)dVar4 | uVar3 & (ulong)local_78)) {
    return 0;
  }
  if (this->b->metric == 0) {
    *r = local_78;
LAB_00129343:
    iVar1 = 1;
  }
  else {
    iVar1 = this->pointmtrindex;
    if (pa[iVar1] <= 0.0) {
      return 1;
    }
    if (pb[iVar1] <= 0.0) {
      return 1;
    }
    if (pc[iVar1] <= 0.0) {
      return 1;
    }
    projpt2face(this_00,checkpt,pa,pb,pc,&local_68);
    facenormal(this_00,pa,pb,pc,&local_48,1,(double *)0x0);
    dVar4 = local_38 * local_38 + local_48 * local_48 + local_40 * local_40;
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    facenormal(this_00,pa,pb,&local_68,&local_48,1,(double *)0x0);
    dVar5 = local_38 * local_38 + local_48 * local_48 + local_40 * local_40;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    facenormal(this_00,pb,pc,&local_68,&local_48,1,(double *)0x0);
    local_70 = local_38 * local_38 + local_48 * local_48 + local_40 * local_40;
    if (local_70 < 0.0) {
      local_70 = sqrt(local_70);
    }
    else {
      local_70 = SQRT(local_70);
    }
    facenormal(this_00,pc,pa,&local_68,&local_48,1,(double *)0x0);
    dVar6 = local_38 * local_38 + local_48 * local_48 + local_40 * local_40;
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      dVar6 = SQRT(dVar6);
    }
    if (ABS((dVar5 + local_70 + dVar6) - dVar4) / dVar4 < this->b->epsilon) {
      iVar1 = this->pointmtrindex;
      local_78 = (dVar6 / dVar4) * pb[iVar1] +
                 (dVar5 / dVar4) * pc[iVar1] + (local_70 / dVar4) * pa[iVar1];
      dVar4 = (checkpt[2] - local_58) * (checkpt[2] - local_58) +
              (*checkpt - local_68) * (*checkpt - local_68) +
              (checkpt[1] - local_60) * (checkpt[1] - local_60);
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      if (dVar4 < local_78) goto LAB_00129343;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int tetgenmesh::checkfac4encroach(point pa, point pb, point pc, point checkpt,
                                  REAL* cent, REAL* r)
{
  REAL rd, len;

  circumsphere(pa, pb, pc, NULL, cent, &rd);
  if (rd == 0) {
    terminatetetgen(this, 2);
  }
  len = distance(cent, checkpt);
  if ((fabs(len - rd) / rd) < b->epsilon) len = rd; // Rounding.
 
  if (len < rd) {
    // The point lies inside the circumsphere of this face.
    if (b->metric) { // -m option.
      if ((pa[pointmtrindex] > 0) && (pb[pointmtrindex] > 0) &&
          (pc[pointmtrindex] > 0)) {
        // Get the projection of 'checkpt' in the plane of pa, pb, and pc.
        REAL prjpt[3], n[3];
        REAL a, a1, a2, a3;
        projpt2face(checkpt, pa, pb, pc, prjpt);
        // Get the face area of [a,b,c].
        facenormal(pa, pb, pc, n, 1, NULL);
        a = sqrt(dot(n,n));
        // Get the face areas of [a,b,p], [b,c,p], and [c,a,p].
        facenormal(pa, pb, prjpt, n, 1, NULL);
        a1 = sqrt(dot(n,n));
        facenormal(pb, pc, prjpt, n, 1, NULL);
        a2 = sqrt(dot(n,n));
        facenormal(pc, pa, prjpt, n, 1, NULL);
        a3 = sqrt(dot(n,n));
        if ((fabs(a1 + a2 + a3 - a) / a) < b->epsilon) {
          // This face contains the projection.
          // Get the mesh size at the location of the projection point.
          rd = a1 / a * pc[pointmtrindex]
             + a2 / a * pa[pointmtrindex]
             + a3 / a * pb[pointmtrindex];
          len = distance(prjpt, checkpt);
          if (len < rd) {
            return 1; // Encroached.
          }
        }
      } else {
        return 1;  // No protecting ball. Encroached.
      }
    } else {
      *r = rd;
      return 1;  // Encroached.
    }
  }

  return 0;
}